

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  u8 uVar1;
  uint uVar2;
  sqlite3 *db;
  Column **ppCVar3;
  i16 *piVar4;
  uint uVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar6;
  Column *pCVar7;
  Expr *pEVar8;
  byte *pKey;
  void *pvVar9;
  Column *pCVar10;
  ulong uVar11;
  byte bVar12;
  ushort uVar13;
  char *z;
  ulong uVar14;
  ExprList_item *pEVar15;
  long lVar16;
  u32 cnt;
  ExprList_item *local_70;
  Column *local_68;
  Column **local_60;
  i16 *local_58;
  ulong local_50;
  Hash ht;
  
  db = pParse->db;
  ht.ht = (_ht *)0x0;
  ht.htsize = 0;
  ht.count = 0;
  ht.first = (HashElem *)0x0;
  if (pEList == (ExprList *)0x0) {
    pCVar7 = (Column *)0x0;
    uVar5 = 0;
  }
  else {
    uVar2 = pEList->nExpr;
    pCVar7 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar2 << 5);
    uVar5 = 0x7fff;
    if ((int)uVar2 < 0x7fff) {
      uVar5 = uVar2;
    }
  }
  *pnCol = (i16)uVar5;
  *paCol = pCVar7;
  local_70 = pEList->a;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  local_50 = (ulong)uVar5;
  uVar14 = 0;
  local_68 = pCVar7;
  local_60 = paCol;
  local_58 = pnCol;
  do {
    uVar11 = local_50;
    if (uVar14 == local_50) {
LAB_00195b10:
      sqlite3HashClear(&ht);
      piVar4 = local_58;
      ppCVar3 = local_60;
      pCVar7 = local_68;
      iVar6 = extraout_EAX;
      if (db->mallocFailed != '\0') {
        for (lVar16 = 0; (uVar11 & 0xffffffff) << 5 != lVar16; lVar16 = lVar16 + 0x20) {
          sqlite3DbFree(db,*(void **)((long)&pCVar7->zName + lVar16));
        }
        sqlite3DbFree(db,pCVar7);
        *ppCVar3 = (Column *)0x0;
        *piVar4 = 0;
        iVar6 = extraout_EAX_00;
      }
      return iVar6;
    }
    if (db->mallocFailed != '\0') {
      uVar11 = uVar14 & 0xffffffff;
      goto LAB_00195b10;
    }
    z = local_70[uVar14].zName;
    if (z == (char *)0x0) {
      pEVar15 = local_70 + uVar14;
      for (pEVar8 = sqlite3ExprSkipCollate(pEVar15->pExpr); uVar1 = pEVar8->op, uVar1 == 0x86;
          pEVar8 = pEVar8->pRight) {
      }
      if (uVar1 == ';') {
        pCVar10 = (Column *)&pEVar8->u;
      }
      else if (uVar1 == 0xa2) {
        uVar13 = pEVar8->iColumn;
        if ((short)uVar13 < 0) {
          uVar13 = ((pEVar8->y).pTab)->iPKey;
          z = "rowid";
          if ((short)uVar13 < 0) goto LAB_00195a1e;
        }
        pCVar10 = ((pEVar8->y).pTab)->aCol + uVar13;
      }
      else {
        pCVar10 = (Column *)&pEVar15->zSpan;
      }
      z = pCVar10->zName;
      if (z != (char *)0x0) goto LAB_00195a1e;
      pKey = (byte *)sqlite3MPrintf(db,"column%d",(ulong)((int)uVar14 + 1));
    }
    else {
LAB_00195a1e:
      pKey = (byte *)sqlite3DbStrDup(db,z);
    }
    cnt = 0;
    while (pKey != (byte *)0x0) {
      pvVar9 = sqlite3HashFind(&ht,(char *)pKey);
      if (pvVar9 == (void *)0x0) {
        pCVar7->zName = (char *)pKey;
        pCVar10 = (Column *)sqlite3HashInsert(&ht,(char *)pKey,pCVar7);
        if (pCVar10 == pCVar7) {
          sqlite3OomFault(db);
        }
        goto LAB_00195ae1;
      }
      uVar5 = sqlite3Strlen30((char *)pKey);
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar11 = (ulong)uVar5;
        do {
          if (uVar11 < 2) {
            bVar12 = *pKey;
            uVar11 = 0;
            break;
          }
          uVar11 = uVar11 - 1;
          bVar12 = pKey[uVar11 & 0xffffffff];
        } while (0xfffffffffffffff5 < (ulong)bVar12 - 0x3a);
        if (bVar12 == 0x3a) {
          uVar5 = (uint)uVar11;
        }
      }
      cnt = cnt + 1;
      pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",(ulong)uVar5,pKey);
      if (3 < cnt) {
        sqlite3_randomness(4,&cnt);
      }
    }
    pCVar7->zName = (char *)0x0;
LAB_00195ae1:
    uVar14 = uVar14 + 1;
    pCVar7 = pCVar7 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( nCol>32767 ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      assert( pColExpr->op!=TK_AGG_COLUMN );
      if( pColExpr->op==TK_COLUMN ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->y.pTab;
        assert( pTab!=0 );
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}